

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

double __thiscall tcu::exp(tcu *this,double __x)

{
  tcu tVar1;
  deRoundingMode dVar2;
  char *in_RSI;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_58;
  
  *this = (tcu)0x0;
  *(undefined8 *)(this + 8) = 0x7ff0000000000000;
  *(undefined8 *)(this + 0x10) = 0xfff0000000000000;
  dVar10 = *(double *)(in_RSI + 8);
  if (dVar10 < *(double *)(in_RSI + 0x10) || dVar10 == *(double *)(in_RSI + 0x10)) {
    dVar2 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar5 = ::exp(dVar10);
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar13 = -INFINITY;
    if (!NAN(dVar5)) {
      dVar13 = dVar5;
    }
    dVar6 = ::exp(dVar10);
    local_58 = INFINITY;
    if (!NAN(dVar6)) {
      local_58 = dVar6;
    }
    deSetRoundingMode(dVar2);
    dVar10 = *(double *)(in_RSI + 0x10);
    dVar2 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar7 = ::exp(dVar10);
    dVar8 = dVar7;
    if (NAN(dVar7)) {
      dVar8 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar9 = ::exp(dVar10);
    deSetRoundingMode(dVar2);
    dVar10 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar5 | -(ulong)NAN(dVar5) & 0x7ff0000000000000);
    dVar12 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000);
    uVar3 = -(ulong)(dVar10 <= local_58);
    uVar4 = -(ulong)(dVar12 <= dVar13);
    dVar11 = (double)(~uVar3 & (ulong)local_58 | uVar3 & (ulong)dVar10);
    dVar10 = (double)(~uVar4 & (ulong)dVar12 | (ulong)dVar13 & uVar4);
    dVar13 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 | -(ulong)NAN(dVar7) & 0xfff0000000000000);
    dVar12 = dVar9;
    if (NAN(dVar9)) {
      dVar12 = -INFINITY;
    }
    uVar3 = -(ulong)(dVar12 <= dVar13);
    dVar12 = (double)(uVar3 & (ulong)dVar13 | ~uVar3 & (ulong)dVar12);
    dVar13 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0x7ff0000000000000);
    uVar3 = -(ulong)(dVar8 <= dVar13);
    dVar13 = (double)(uVar3 & (ulong)dVar8 | ~uVar3 & (ulong)dVar13);
    tVar1 = (tcu)((-(NAN(dVar6) || NAN(dVar5)) | -(NAN(dVar7) || NAN(dVar9))) & 1);
    uVar3 = -(ulong)(dVar11 <= dVar13);
    uVar4 = uVar3 & (ulong)dVar11 | ~uVar3 & (ulong)dVar13;
    uVar3 = -(ulong)(dVar12 <= dVar10);
    uVar3 = uVar3 & (ulong)dVar10 | ~uVar3 & (ulong)dVar12;
  }
  else {
    uVar4 = 0x7ff0000000000000;
    uVar3 = 0xfff0000000000000;
    tVar1 = (tcu)0x0;
  }
  *this = tVar1;
  *(ulong *)(this + 8) = uVar4;
  *(ulong *)(this + 0x10) = uVar3;
  if (*in_RSI == '\x01') {
    *this = (tcu)0x1;
    *(ulong *)(this + 0x10) = uVar3;
  }
  return dVar10;
}

Assistant:

Interval exp (const Interval& x)
{
	return applyMonotone(std::exp, x);
}